

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::erase
          (Span<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *this,size_t bucket)

{
  byte bVar1;
  void *pvVar2;
  Entry *pEVar3;
  void *pvVar4;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar3 = this->entries;
  pvVar4 = *(void **)&pEVar3[bVar1].storage.field_0x18;
  if (pvVar4 != (void *)0x0) {
    do {
      pvVar2 = *(void **)((long)pvVar4 + 8);
      operator_delete(pvVar4,0x10);
      pvVar4 = pvVar2;
    } while (pvVar2 != (void *)0x0);
    pEVar3 = this->entries;
  }
  *(uchar *)&pEVar3[bVar1].storage = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }